

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

bool Data649::loadArchive(char *fname,Issues *issues)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  long lVar7;
  int local_44c;
  vector<int,_std::allocator<int>_> arr;
  Draw local_424;
  Issues *local_408;
  string line;
  int a;
  int local_3dc;
  int iStack_3d8;
  _Vector_base<Data649::Draw,_std::allocator<Data649::Draw>_> local_3d0;
  ifstream fin;
  byte abStack_398 [488];
  istringstream iss;
  byte abStack_190 [352];
  
  std::vector<Data649::Issue,_std::allocator<Data649::Issue>_>::clear(issues);
  std::ifstream::ifstream(&fin,fname,_S_in);
  bVar6 = false;
  if (*(int *)(abStack_398 + *(long *)(_fin + -0x18)) == 0) {
    local_44c = 0;
    local_408 = issues;
    do {
      line._M_dataplus._M_p = (pointer)&line.field_2;
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&fin,(string *)&line);
      if ((abStack_398[*(long *)(_fin + -0x18)] & 2) != 0) {
        std::__cxx11::string::~string((string *)&line);
        bVar6 = true;
        std::ifstream::close();
        goto LAB_001025b7;
      }
      arr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      arr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)0x0;
      arr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&line,_S_in);
      while ((abStack_190[*(long *)(_iss + -0x18)] & 2) == 0) {
        std::istream::operator>>((istream *)&iss,&a);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   &arr.super__Vector_base<int,_std::allocator<int>_>,(value_type_conflict *)&a);
      }
      uVar3 = (ulong)((long)arr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)arr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2;
      iVar2 = (int)uVar3;
      uVar4 = iVar2 - 8;
      uVar1 = uVar4 >> 1;
      if (((uVar1 | (uint)((uVar4 & 1) != 0) << 0x1f) < 10) && ((0x249U >> (uVar1 & 0x1f) & 1) != 0)
         ) {
        local_3d0._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_3d0._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_3d0._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        a = local_44c;
        iStack_3d8 = *arr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
        local_3dc = arr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[1];
        uVar3 = (long)(iVar2 + -2) / 6;
        uVar5 = uVar3 & 0xffffffff;
        if ((int)uVar3 < 1) {
          uVar5 = 0;
        }
        lVar7 = 0x1c;
        for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
          local_424.id = (int)uVar3;
          local_424.nums._M_elems[0] =
               *(int *)((long)arr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar7 + -0x14);
          local_424.nums._M_elems[1] =
               *(int *)((long)arr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar7 + -0x10);
          local_424.nums._M_elems[2] =
               *(int *)((long)arr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar7 + -0xc);
          local_424.nums._M_elems[3] =
               *(int *)((long)arr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar7 + -8);
          local_424.nums._M_elems[4] =
               *(int *)((long)arr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar7 + -4);
          local_424.nums._M_elems[5] =
               *(int *)((long)arr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar7);
          std::vector<Data649::Draw,_std::allocator<Data649::Draw>_>::emplace_back<Data649::Draw>
                    ((vector<Data649::Draw,_std::allocator<Data649::Draw>_> *)&local_3d0,&local_424)
          ;
          lVar7 = lVar7 + 0x18;
        }
        std::vector<Data649::Issue,_std::allocator<Data649::Issue>_>::emplace_back<Data649::Issue>
                  (local_408,(Issue *)&a);
        local_44c = local_44c + 1;
        std::_Vector_base<Data649::Draw,_std::allocator<Data649::Draw>_>::~_Vector_base(&local_3d0);
        bVar6 = true;
      }
      else {
        bVar6 = false;
        fprintf(_stderr,"Unexpected number of integers in archive line: %d\n",uVar3 & 0xffffffff);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&arr.super__Vector_base<int,_std::allocator<int>_>);
      std::__cxx11::string::~string((string *)&line);
    } while (bVar6);
    bVar6 = false;
  }
LAB_001025b7:
  std::ifstream::~ifstream(&fin);
  return bVar6;
}

Assistant:

bool loadArchive(const char * fname, Issues & issues) {
    issues.clear();

    std::ifstream fin(fname);
    if (!fin.good()) return false;

    int curIssueId = 0;

    while (true) {
        std::string line;
        std::getline(fin, line);
        if (fin.eof()) break;

        std::vector<int> arr;
        std::istringstream iss(line);
        while (true) {
            int a;
            if (iss.eof()) break;
            iss >> a;
            arr.push_back(a);
        }

        int n = arr.size();
        if (n != 8 && n != 14 && n != 20 && n != 26) {
            fprintf(stderr, "Unexpected number of integers in archive line: %d\n", n);
            return false;
        }

        Issue issue;
        issue.id = curIssueId;
        issue.year = arr[0];
        issue.idYear = arr[1];

        int ndraws = (n - 2)/6;
        for (int i = 0; i < ndraws; ++i) {
            Draw draw;
            draw.id = i;
            draw.nums[0] = arr[2 + i*6 + 0];
            draw.nums[1] = arr[2 + i*6 + 1];
            draw.nums[2] = arr[2 + i*6 + 2];
            draw.nums[3] = arr[2 + i*6 + 3];
            draw.nums[4] = arr[2 + i*6 + 4];
            draw.nums[5] = arr[2 + i*6 + 5];

            issue.draws.emplace_back(std::move(draw));
        }

        issues.emplace_back(std::move(issue));

        ++curIssueId;
    }

    fin.close();

    return true;
}